

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_get_current_tabpage(Nvim *this)

{
  allocator local_31;
  string local_30;
  Nvim *local_10;
  Nvim *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"nvim_get_current_tabpage",&local_31);
  NvimRPC::async_call<>(&this->client_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void Nvim::async_get_current_tabpage() {
    client_.async_call("nvim_get_current_tabpage");
}